

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_context_output_format(unqlite_context *pCtx,char *zFormat,...)

{
  jx9_vm *pjVar1;
  char in_AL;
  int iVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  sxu32 n;
  va_list ap;
  sxu32 local_10c;
  jx9_vm *local_108;
  void *local_100;
  undefined8 uStack_f8;
  uint local_f0;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &stack0x00000008;
  local_e8.gp_offset = 0x10;
  local_e8.fp_offset = 0x30;
  pjVar1 = pCtx->pVm;
  local_100 = (void *)0x0;
  uStack_f8 = 0;
  iVar2 = 0;
  local_f0 = 0;
  local_10c = 0;
  local_108 = pjVar1;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  FormatMount(6,&local_108,(ProcConsumer)0x0,(void *)0x0,&local_10c,zFormat,&local_e8);
  if ((uint)uStack_f8 != 0) {
    iVar2 = (*(pjVar1->sVmConsumer).xConsumer)
                      (local_100,(uint)uStack_f8,(pjVar1->sVmConsumer).pUserData);
  }
  pjVar1->nOutputLen = pjVar1->nOutputLen + (uint)uStack_f8;
  if (((local_f0 & 6) == 0) && (uStack_f8._4_4_ != 0)) {
    SyMemBackendFree(&local_108->sAllocator,local_100);
  }
  return iVar2;
}

Assistant:

int unqlite_context_output_format(unqlite_context *pCtx,const char *zFormat, ...)
{
	va_list ap;
	int rc;
	va_start(ap, zFormat);
	rc = jx9VmOutputConsumeAp(pCtx->pVm,zFormat, ap);
	va_end(ap);
	return rc;
}